

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void dr_prediction_z1_32xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  long lVar4;
  long in_RCX;
  long lVar5;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int in_R9D;
  short sVar6;
  ushort uVar7;
  short sVar10;
  ushort uVar11;
  ushort uVar12;
  short sVar13;
  ushort uVar14;
  ushort uVar15;
  short sVar16;
  ushort uVar17;
  ushort uVar18;
  short sVar19;
  ushort uVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  ushort uVar27;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  short sVar28;
  ushort uVar29;
  ushort uVar30;
  __m128i dstvec [64];
  int mdiff;
  int jj;
  int j;
  __m128i shift;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_above;
  __m128i a0_above;
  __m128i res16 [2];
  __m128i res1;
  __m128i res;
  __m128i b;
  int r;
  int x;
  __m128i c3f;
  __m128i diff;
  __m128i a_mbase_x;
  __m128i a16;
  __m128i a32;
  __m128i a1;
  __m128i a0;
  int max_base_x;
  int frac_bits;
  int local_cdc;
  undefined8 local_cd8 [128];
  undefined8 local_8d8 [134];
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  int local_464;
  int local_460;
  int local_45c;
  ushort local_458;
  ushort uStack_456;
  ushort uStack_454;
  ushort uStack_452;
  ushort uStack_450;
  ushort uStack_44e;
  ushort uStack_44c;
  ushort uStack_44a;
  int local_444;
  int local_440;
  int local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ushort local_3f8;
  ushort uStack_3f6;
  ushort uStack_3f4;
  ushort uStack_3f2;
  ushort uStack_3f0;
  ushort uStack_3ee;
  ushort uStack_3ec;
  ushort uStack_3ea;
  ushort local_3e8;
  ushort uStack_3e6;
  ushort uStack_3e4;
  ushort uStack_3e2;
  ushort uStack_3e0;
  ushort uStack_3de;
  ushort uStack_3dc;
  ushort uStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  int local_3c0;
  int local_3bc;
  ulong local_3b8;
  ulong uStack_3b0;
  short local_3a8;
  short sStack_3a6;
  short sStack_3a4;
  short sStack_3a2;
  short sStack_3a0;
  short sStack_39e;
  short sStack_39c;
  short sStack_39a;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  int local_348;
  undefined4 local_344;
  int local_340;
  long local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  int local_31c;
  undefined2 local_318;
  undefined2 local_316;
  undefined2 local_314;
  undefined1 local_311;
  undefined1 (*local_310) [16];
  undefined1 (*local_308) [16];
  undefined4 local_2fc;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined4 local_2dc;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined4 local_2bc;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined4 local_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  int i_1;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  ulong local_48;
  ulong uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_10 [3];
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8 [3];
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_328 = local_8d8;
  local_330 = local_cd8;
  local_344 = 6;
  local_348 = in_EDI + 0x1f;
  local_314 = 0x10;
  local_6a = 0x10;
  local_6c = 0x10;
  local_6e = 0x10;
  local_70 = 0x10;
  i_1._2_2_ = 0x10;
  i_1._0_2_ = 0x10;
  local_76 = 0x10;
  local_78 = 0x10;
  local_88 = 0x10001000100010;
  uStack_80 = 0x10001000100010;
  local_388 = 0x10001000100010;
  uStack_380 = 0x10001000100010;
  local_311 = *(undefined1 *)(in_RCX + (in_EDI + 0x1f));
  local_1 = local_311;
  local_2 = local_311;
  local_3 = local_311;
  local_4 = local_311;
  local_5 = local_311;
  local_8 = (undefined1  [3])CONCAT21(CONCAT11(local_311,local_311),local_311);
  local_9 = local_311;
  local_a = local_311;
  local_b = local_311;
  local_c = local_311;
  local_d = local_311;
  local_10 = (undefined1  [3])CONCAT21(CONCAT11(local_311,local_311),local_311);
  local_28 = CONCAT17(local_311,
                      CONCAT16(local_311,
                               CONCAT15(local_311,CONCAT14(local_311,CONCAT13(local_311,local_10))))
                     );
  uStack_20 = CONCAT17(local_311,
                       CONCAT16(local_311,
                                CONCAT15(local_311,CONCAT14(local_311,CONCAT13(local_311,local_8))))
                      );
  local_398 = local_28;
  uStack_390 = uStack_20;
  local_316 = 0x3f;
  local_4a = 0x3f;
  local_4c = 0x3f;
  local_4e = 0x3f;
  local_50 = 0x3f;
  local_52 = 0x3f;
  local_54 = 0x3f;
  local_56 = 0x3f;
  local_58 = 0x3f;
  local_68 = 0x3f003f003f003f;
  uStack_60 = 0x3f003f003f003f;
  local_3b8 = 0x3f003f003f003f;
  uStack_3b0 = 0x3f003f003f003f;
  local_3c0 = 0;
  local_3bc = in_R9D;
  local_340 = in_R9D;
  local_338 = in_RCX;
  local_31c = in_EDI;
  while( true ) {
    if (local_31c <= local_3c0) goto LAB_005271bd;
    local_43c = local_3bc >> 6;
    local_440 = local_348 - local_43c;
    if (local_440 < 1) break;
    if (0x20 < local_440) {
      local_440 = 0x20;
    }
    local_318 = (undefined2)local_3bc;
    local_2a = (undefined2)local_3bc;
    local_2c = (undefined2)local_3bc;
    local_2e = (undefined2)local_3bc;
    local_30 = (undefined2)local_3bc;
    local_32 = (undefined2)local_3bc;
    local_34 = (undefined2)local_3bc;
    local_36 = (undefined2)local_3bc;
    local_38 = (undefined2)local_3bc;
    local_48 = CONCAT26((undefined2)local_3bc,
                        CONCAT24((undefined2)local_3bc,
                                 CONCAT22((undefined2)local_3bc,(undefined2)local_3bc)));
    uStack_40 = CONCAT26((undefined2)local_3bc,
                         CONCAT24((undefined2)local_3bc,
                                  CONCAT22((undefined2)local_3bc,(undefined2)local_3bc)));
    local_298 = local_48;
    uStack_290 = uStack_40;
    local_2a8 = local_3b8;
    uStack_2a0 = uStack_3b0;
    local_48 = local_48 & local_3b8;
    uStack_40 = uStack_40 & uStack_3b0;
    local_2b8 = local_48;
    uStack_2b0 = uStack_40;
    local_2bc = 1;
    local_2b8._0_2_ = (ushort)local_48;
    local_2b8._2_2_ = (ushort)(local_48 >> 0x10);
    local_2b8._4_2_ = (ushort)(local_48 >> 0x20);
    uStack_2b0._0_2_ = (ushort)uStack_40;
    uStack_2b0._2_2_ = (ushort)(uStack_40 >> 0x10);
    uStack_2b0._4_2_ = (ushort)(uStack_40 >> 0x20);
    local_458 = (ushort)local_2b8 >> 1;
    uStack_456 = local_2b8._2_2_ >> 1;
    uStack_454 = local_2b8._4_2_ >> 1;
    uStack_452 = (ushort)(local_48 >> 0x31);
    uStack_450 = (ushort)uStack_2b0 >> 1;
    uStack_44e = uStack_2b0._2_2_ >> 1;
    uStack_44c = uStack_2b0._4_2_ >> 1;
    uStack_44a = (ushort)(uStack_40 >> 0x31);
    local_460 = 0;
    for (local_45c = 0; uVar3 = uStack_390, local_45c < 0x20; local_45c = local_45c + 0x10) {
      local_464 = local_440 - local_45c;
      if (local_440 - local_45c < 1) {
        (&local_418)[(long)local_460 * 2] = local_398;
        (&uStack_410)[(long)local_460 * 2] = uVar3;
      }
      else {
        local_308 = (undefined1 (*) [16])(local_338 + local_43c + (long)local_45c);
        local_428 = *(undefined8 *)*local_308;
        uStack_420 = *(undefined8 *)(*local_308 + 8);
        local_310 = (undefined1 (*) [16])((long)local_45c + 1 + local_338 + local_43c);
        local_438 = *(undefined8 *)*local_310;
        uStack_430 = *(undefined8 *)(*local_310 + 8);
        local_218 = *local_308;
        auVar8 = pmovzxbw(*local_308,*(undefined8 *)*local_308);
        local_228 = *local_310;
        auVar9 = pmovzxbw(*local_310,*(undefined8 *)*local_310);
        local_368._0_8_ = auVar9._0_8_;
        local_368._8_8_ = auVar9._8_8_;
        local_358._0_8_ = auVar8._0_8_;
        local_358._8_8_ = auVar8._8_8_;
        local_1d8 = local_368._0_8_;
        uStack_1d0 = local_368._8_8_;
        local_1e8 = local_358._0_8_;
        uStack_1e0 = local_358._8_8_;
        local_1d8._0_2_ = auVar9._0_2_;
        local_1d8._2_2_ = auVar9._2_2_;
        local_1d8._4_2_ = auVar9._4_2_;
        local_1d8._6_2_ = auVar9._6_2_;
        uStack_1d0._0_2_ = auVar9._8_2_;
        uStack_1d0._2_2_ = auVar9._10_2_;
        uStack_1d0._4_2_ = auVar9._12_2_;
        uStack_1d0._6_2_ = auVar9._14_2_;
        local_1e8._0_2_ = auVar8._0_2_;
        local_1e8._2_2_ = auVar8._2_2_;
        local_1e8._4_2_ = auVar8._4_2_;
        local_1e8._6_2_ = auVar8._6_2_;
        uStack_1e0._0_2_ = auVar8._8_2_;
        uStack_1e0._2_2_ = auVar8._10_2_;
        uStack_1e0._4_2_ = auVar8._12_2_;
        uStack_1e0._6_2_ = auVar8._14_2_;
        local_258 = local_358._0_8_;
        uStack_250 = local_358._8_8_;
        local_25c = 5;
        auVar8 = psllw(auVar8,ZEXT416(5));
        local_378 = auVar8._0_8_;
        uStack_370 = auVar8._8_8_;
        local_158 = local_378;
        uStack_150 = uStack_370;
        local_168 = local_388;
        uStack_160 = uStack_380;
        local_158._0_2_ = auVar8._0_2_;
        local_158._2_2_ = auVar8._2_2_;
        local_158._4_2_ = auVar8._4_2_;
        local_158._6_2_ = auVar8._6_2_;
        uStack_150._0_2_ = auVar8._8_2_;
        uStack_150._2_2_ = auVar8._10_2_;
        uStack_150._4_2_ = auVar8._12_2_;
        uStack_150._6_2_ = auVar8._14_2_;
        local_168._0_2_ = (short)local_388;
        local_168._2_2_ = (short)((ulong)local_388 >> 0x10);
        local_168._4_2_ = (short)((ulong)local_388 >> 0x20);
        local_168._6_2_ = (short)((ulong)local_388 >> 0x30);
        uStack_160._0_2_ = (short)uStack_380;
        uStack_160._2_2_ = (short)((ulong)uStack_380 >> 0x10);
        uStack_160._4_2_ = (short)((ulong)uStack_380 >> 0x20);
        uStack_160._6_2_ = (short)((ulong)uStack_380 >> 0x30);
        local_378._0_4_ =
             CONCAT22(local_158._2_2_ + local_168._2_2_,(short)local_158 + (short)local_168);
        local_378._0_6_ = CONCAT24(local_158._4_2_ + local_168._4_2_,(undefined4)local_378);
        local_378 = CONCAT26(local_158._6_2_ + local_168._6_2_,(undefined6)local_378);
        uStack_370._0_2_ = (short)uStack_150 + (short)uStack_160;
        uStack_370._2_2_ = uStack_150._2_2_ + uStack_160._2_2_;
        uStack_370._4_2_ = uStack_150._4_2_ + uStack_160._4_2_;
        uStack_370._6_2_ = uStack_150._6_2_ + uStack_160._6_2_;
        local_118 = CONCAT26(local_1d8._6_2_ - local_1e8._6_2_,
                             CONCAT24(local_1d8._4_2_ - local_1e8._4_2_,
                                      CONCAT22(local_1d8._2_2_ - local_1e8._2_2_,
                                               (short)local_1d8 - (short)local_1e8)));
        uStack_110 = CONCAT26(uStack_1d0._6_2_ - uStack_1e0._6_2_,
                              CONCAT24(uStack_1d0._4_2_ - uStack_1e0._4_2_,
                                       CONCAT22(uStack_1d0._2_2_ - uStack_1e0._2_2_,
                                                (short)uStack_1d0 - (short)uStack_1e0)));
        local_128 = CONCAT26(uStack_452,CONCAT24(uStack_454,CONCAT22(uStack_456,local_458)));
        uStack_120 = CONCAT26(uStack_44a,CONCAT24(uStack_44c,CONCAT22(uStack_44e,uStack_450)));
        sVar6 = ((short)local_1d8 - (short)local_1e8) * local_458;
        sVar10 = (local_1d8._2_2_ - local_1e8._2_2_) * uStack_456;
        sVar13 = (local_1d8._4_2_ - local_1e8._4_2_) * uStack_454;
        sVar16 = (local_1d8._6_2_ - local_1e8._6_2_) * uStack_452;
        sVar19 = ((short)uStack_1d0 - (short)uStack_1e0) * uStack_450;
        sVar22 = (uStack_1d0._2_2_ - uStack_1e0._2_2_) * uStack_44e;
        sVar25 = (uStack_1d0._4_2_ - uStack_1e0._4_2_) * uStack_44c;
        sVar28 = (uStack_1d0._6_2_ - uStack_1e0._6_2_) * uStack_44a;
        local_178 = local_378;
        uStack_170 = uStack_370;
        local_188 = CONCAT26(sVar16,CONCAT24(sVar13,CONCAT22(sVar10,sVar6)));
        uStack_180 = CONCAT26(sVar28,CONCAT24(sVar25,CONCAT22(sVar22,sVar19)));
        local_3e8 = (short)local_158 + (short)local_168 + sVar6;
        uVar11 = local_158._2_2_ + local_168._2_2_ + sVar10;
        uVar14 = local_158._4_2_ + local_168._4_2_ + sVar13;
        uVar17 = local_158._6_2_ + local_168._6_2_ + sVar16;
        uVar20 = (short)uStack_150 + (short)uStack_160 + sVar19;
        uVar23 = uStack_150._2_2_ + uStack_160._2_2_ + sVar22;
        uVar26 = uStack_150._4_2_ + uStack_160._4_2_ + sVar25;
        uVar29 = uStack_150._6_2_ + uStack_160._6_2_ + sVar28;
        local_2d8 = CONCAT26(uVar17,CONCAT24(uVar14,CONCAT22(uVar11,local_3e8)));
        uStack_2d0 = CONCAT26(uVar29,CONCAT24(uVar26,CONCAT22(uVar23,uVar20)));
        local_2dc = 5;
        local_3e8 = local_3e8 >> 5;
        uVar11 = uVar11 >> 5;
        uVar14 = uVar14 >> 5;
        uVar17 = uVar17 >> 5;
        uVar20 = uVar20 >> 5;
        uVar23 = uVar23 >> 5;
        uVar26 = uVar26 >> 5;
        uVar29 = uVar29 >> 5;
        uStack_3e6 = uVar11;
        uStack_3e4 = uVar14;
        uStack_3e2 = uVar17;
        uStack_3e0 = uVar20;
        uStack_3de = uVar23;
        uStack_3dc = uVar26;
        uStack_3da = uVar29;
        auVar8 = *local_308 >> 0x40;
        local_238 = auVar8;
        local_238._0_8_ = SUB168(*local_308,8);
        local_358 = pmovzxbw(auVar8,local_238._0_8_);
        auVar8 = *local_310 >> 0x40;
        local_248 = auVar8;
        local_248._0_8_ = SUB168(*local_310,8);
        local_368 = pmovzxbw(auVar8,local_248._0_8_);
        local_1f8 = local_368._0_8_;
        uStack_1f0 = local_368._8_8_;
        local_208 = local_358._0_8_;
        uStack_200 = local_358._8_8_;
        local_1f8._0_2_ = local_368._0_2_;
        local_1f8._2_2_ = local_368._2_2_;
        local_1f8._4_2_ = local_368._4_2_;
        local_1f8._6_2_ = local_368._6_2_;
        uStack_1f0._0_2_ = local_368._8_2_;
        uStack_1f0._2_2_ = local_368._10_2_;
        uStack_1f0._4_2_ = local_368._12_2_;
        uStack_1f0._6_2_ = local_368._14_2_;
        local_208._0_2_ = local_358._0_2_;
        local_208._2_2_ = local_358._2_2_;
        local_208._4_2_ = local_358._4_2_;
        local_208._6_2_ = local_358._6_2_;
        uStack_200._0_2_ = local_358._8_2_;
        uStack_200._2_2_ = local_358._10_2_;
        uStack_200._4_2_ = local_358._12_2_;
        uStack_200._6_2_ = local_358._14_2_;
        local_3a8 = (short)local_1f8 - (short)local_208;
        sStack_3a6 = local_1f8._2_2_ - local_208._2_2_;
        sStack_3a4 = local_1f8._4_2_ - local_208._4_2_;
        sStack_3a2 = local_1f8._6_2_ - local_208._6_2_;
        sStack_3a0 = (short)uStack_1f0 - (short)uStack_200;
        sStack_39e = uStack_1f0._2_2_ - uStack_200._2_2_;
        sStack_39c = uStack_1f0._4_2_ - uStack_200._4_2_;
        sStack_39a = uStack_1f0._6_2_ - uStack_200._6_2_;
        local_278 = local_358._0_8_;
        uStack_270 = local_358._8_8_;
        local_27c = 5;
        auVar8 = psllw(local_358,ZEXT416(5));
        local_378 = auVar8._0_8_;
        uStack_370 = auVar8._8_8_;
        local_198 = local_378;
        uStack_190 = uStack_370;
        local_1a8 = local_388;
        uStack_1a0 = uStack_380;
        local_198._0_2_ = auVar8._0_2_;
        local_198._2_2_ = auVar8._2_2_;
        local_198._4_2_ = auVar8._4_2_;
        local_198._6_2_ = auVar8._6_2_;
        uStack_190._0_2_ = auVar8._8_2_;
        uStack_190._2_2_ = auVar8._10_2_;
        uStack_190._4_2_ = auVar8._12_2_;
        uStack_190._6_2_ = auVar8._14_2_;
        local_378._0_4_ =
             CONCAT22(local_198._2_2_ + local_168._2_2_,(short)local_198 + (short)local_168);
        local_378._0_6_ = CONCAT24(local_198._4_2_ + local_168._4_2_,(undefined4)local_378);
        local_378 = CONCAT26(local_198._6_2_ + local_168._6_2_,(undefined6)local_378);
        uStack_370._0_2_ = (short)uStack_190 + (short)uStack_160;
        uStack_370._2_2_ = uStack_190._2_2_ + uStack_160._2_2_;
        uStack_370._4_2_ = uStack_190._4_2_ + uStack_160._4_2_;
        uStack_370._6_2_ = uStack_190._6_2_ + uStack_160._6_2_;
        local_138 = CONCAT26(sStack_3a2,CONCAT24(sStack_3a4,CONCAT22(sStack_3a6,local_3a8)));
        uStack_130 = CONCAT26(sStack_39a,CONCAT24(sStack_39c,CONCAT22(sStack_39e,sStack_3a0)));
        local_148 = CONCAT26(uStack_452,CONCAT24(uStack_454,CONCAT22(uStack_456,local_458)));
        uStack_140 = CONCAT26(uStack_44a,CONCAT24(uStack_44c,CONCAT22(uStack_44e,uStack_450)));
        local_3d8 = local_3a8 * local_458;
        sStack_3d6 = sStack_3a6 * uStack_456;
        sStack_3d4 = sStack_3a4 * uStack_454;
        sStack_3d2 = sStack_3a2 * uStack_452;
        sStack_3d0 = sStack_3a0 * uStack_450;
        sStack_3ce = sStack_39e * uStack_44e;
        sStack_3cc = sStack_39c * uStack_44c;
        sStack_3ca = sStack_39a * uStack_44a;
        local_1b8 = local_378;
        uStack_1b0 = uStack_370;
        local_1c8 = CONCAT26(sStack_3d2,CONCAT24(sStack_3d4,CONCAT22(sStack_3d6,local_3d8)));
        uStack_1c0 = CONCAT26(sStack_3ca,CONCAT24(sStack_3cc,CONCAT22(sStack_3ce,sStack_3d0)));
        uVar7 = (short)local_198 + (short)local_168 + local_3d8;
        uVar12 = local_198._2_2_ + local_168._2_2_ + sStack_3d6;
        uVar15 = local_198._4_2_ + local_168._4_2_ + sStack_3d4;
        uVar18 = local_198._6_2_ + local_168._6_2_ + sStack_3d2;
        uVar21 = (short)uStack_190 + (short)uStack_160 + sStack_3d0;
        uVar24 = uStack_190._2_2_ + uStack_160._2_2_ + sStack_3ce;
        uVar27 = uStack_190._4_2_ + uStack_160._4_2_ + sStack_3cc;
        uVar30 = uStack_190._6_2_ + uStack_160._6_2_ + sStack_3ca;
        local_2f8 = CONCAT26(uVar18,CONCAT24(uVar15,CONCAT22(uVar12,uVar7)));
        uStack_2f0 = CONCAT26(uVar30,CONCAT24(uVar27,CONCAT22(uVar24,uVar21)));
        local_2fc = 5;
        uVar7 = uVar7 >> 5;
        uVar12 = uVar12 >> 5;
        uVar15 = uVar15 >> 5;
        uVar18 = uVar18 >> 5;
        uVar21 = uVar21 >> 5;
        uVar24 = uVar24 >> 5;
        uVar27 = uVar27 >> 5;
        uVar30 = uVar30 >> 5;
        local_3f8 = uVar7;
        uStack_3f6 = uVar12;
        uStack_3f4 = uVar15;
        uStack_3f2 = uVar18;
        uStack_3f0 = uVar21;
        uStack_3ee = uVar24;
        uStack_3ec = uVar27;
        uStack_3ea = uVar30;
        local_f8 = CONCAT26(uVar17,CONCAT24(uVar14,CONCAT22(uVar11,local_3e8)));
        uStack_f0 = CONCAT26(uVar29,CONCAT24(uVar26,CONCAT22(uVar23,uVar20)));
        local_108 = CONCAT26(uVar18,CONCAT24(uVar15,CONCAT22(uVar12,uVar7)));
        uStack_100 = CONCAT26(uVar30,CONCAT24(uVar27,CONCAT22(uVar24,uVar21)));
        lVar4 = (long)local_460;
        lVar5 = lVar4 * 0x10;
        *(char *)(&local_418 + lVar4 * 2) =
             (local_3e8 != 0) * (local_3e8 < 0x100) * (char)local_3e8 - (0xff < local_3e8);
        *(char *)((long)&local_418 + lVar5 + 1) =
             (uVar11 != 0) * (uVar11 < 0x100) * (char)uVar11 - (0xff < uVar11);
        *(char *)((long)&local_418 + lVar5 + 2) =
             (uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14);
        *(char *)((long)&local_418 + lVar5 + 3) =
             (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
        *(char *)((long)&local_418 + lVar5 + 4) =
             (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
        *(char *)((long)&local_418 + lVar5 + 5) =
             (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
        *(char *)((long)&local_418 + lVar5 + 6) =
             (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
        *(char *)((long)&local_418 + lVar5 + 7) =
             (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
        *(char *)(&uStack_410 + lVar4 * 2) =
             (uVar7 != 0) * (uVar7 < 0x100) * (char)uVar7 - (0xff < uVar7);
        *(char *)((long)&uStack_410 + lVar5 + 1) =
             (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 - (0xff < uVar12);
        *(char *)((long)&uStack_410 + lVar5 + 2) =
             (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
        *(char *)((long)&uStack_410 + lVar5 + 3) =
             (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
        *(char *)((long)&uStack_410 + lVar5 + 4) =
             (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
        *(char *)((long)&uStack_410 + lVar5 + 5) =
             (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
        *(char *)((long)&uStack_410 + lVar5 + 6) =
             (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
        *(char *)((long)&uStack_410 + lVar5 + 7) =
             (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
      }
      local_460 = local_460 + 1;
    }
    local_98 = local_398;
    uStack_90 = uStack_390;
    local_a8 = local_418;
    uStack_a0 = uStack_410;
    local_b8 = *(undefined8 *)Mask[0][local_440];
    uStack_b0 = *(undefined8 *)(Mask[0][local_440] + 8);
    auVar2._8_8_ = uStack_390;
    auVar2._0_8_ = local_398;
    auVar1._8_8_ = uStack_410;
    auVar1._0_8_ = local_418;
    auVar8 = pblendvb(auVar2,auVar1,(undefined1  [16])Mask[0][local_440]);
    *(undefined1 (*) [16])(local_328 + (long)local_3c0 * 2) = auVar8;
    local_c8 = local_398;
    uStack_c0 = uStack_390;
    local_d8 = local_408;
    uStack_d0 = uStack_400;
    local_e8 = *(undefined8 *)Mask[1][local_440];
    uStack_e0 = *(undefined8 *)(Mask[1][local_440] + 8);
    auVar9._8_8_ = uStack_390;
    auVar9._0_8_ = local_398;
    auVar8._8_8_ = uStack_400;
    auVar8._0_8_ = local_408;
    auVar8 = pblendvb(auVar9,auVar8,(undefined1  [16])Mask[1][local_440]);
    *(undefined1 (*) [16])(local_330 + (long)local_3c0 * 2) = auVar8;
    local_3bc = local_340 + local_3bc;
    local_3c0 = local_3c0 + 1;
  }
  for (local_444 = local_3c0; local_444 < local_31c; local_444 = local_444 + 1) {
    local_328[(long)local_444 * 2] = local_398;
    (local_328 + (long)local_444 * 2)[1] = uStack_390;
    local_330[(long)local_444 * 2] = local_398;
    (local_330 + (long)local_444 * 2)[1] = uStack_390;
  }
LAB_005271bd:
  for (local_cdc = 0; local_cdc < in_EDI; local_cdc = local_cdc + 1) {
    local_470 = (undefined8 *)(in_RSI + in_RDX * local_cdc);
    uStack_480 = local_8d8[(long)local_cdc * 2 + 1];
    local_488 = local_8d8[(long)local_cdc * 2];
    *local_470 = local_8d8[(long)local_cdc * 2];
    local_470[1] = uStack_480;
    lVar4 = in_RSI + in_RDX * local_cdc;
    local_490 = (undefined8 *)(lVar4 + 0x10);
    uStack_4a0 = local_cd8[(long)local_cdc * 2 + 1];
    local_4a8 = local_cd8[(long)local_cdc * 2];
    *local_490 = local_cd8[(long)local_cdc * 2];
    *(undefined8 *)(lVar4 + 0x18) = uStack_4a0;
  }
  return;
}

Assistant:

static void dr_prediction_z1_32xN_sse4_1(int N, uint8_t *dst, ptrdiff_t stride,
                                         const uint8_t *above,
                                         int upsample_above, int dx) {
  __m128i dstvec[64], dstvec_h[64];
  dr_prediction_z1_32xN_internal_sse4_1(N, dstvec, dstvec_h, above,
                                        upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm_storeu_si128((__m128i *)(dst + stride * i), dstvec[i]);
    _mm_storeu_si128((__m128i *)(dst + stride * i + 16), dstvec_h[i]);
  }
}